

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

void acmod_activate_hmm(acmod_t *acmod,hmm_t *hmm)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  uint *puVar4;
  bitvec_t *pbVar5;
  ulong uVar6;
  
  if (acmod->compallsen != '\0') {
    return;
  }
  bVar1 = hmm->n_emit_state;
  uVar3 = (ulong)bVar1;
  if (hmm->mpx == '\0') {
    if (uVar3 == 5) {
      pbVar5 = acmod->senone_active_vec;
      pbVar5[hmm->senid[4] >> 5] = pbVar5[hmm->senid[4] >> 5] | 1 << ((byte)hmm->senid[4] & 0x1f);
      pbVar5[hmm->senid[3] >> 5] = pbVar5[hmm->senid[3] >> 5] | 1 << ((byte)hmm->senid[3] & 0x1f);
    }
    else {
      if (bVar1 != 3) {
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          acmod->senone_active_vec[hmm->senid[uVar6] >> 5] =
               acmod->senone_active_vec[hmm->senid[uVar6] >> 5] |
               1 << ((byte)hmm->senid[uVar6] & 0x1f);
        }
        return;
      }
      pbVar5 = acmod->senone_active_vec;
    }
    pbVar5[hmm->senid[2] >> 5] = pbVar5[hmm->senid[2] >> 5] | 1 << ((byte)hmm->senid[2] & 0x1f);
    pbVar5[hmm->senid[1] >> 5] = pbVar5[hmm->senid[1] >> 5] | 1 << ((byte)hmm->senid[1] & 0x1f);
    bVar1 = (byte)hmm->senid[0];
    puVar4 = pbVar5 + (hmm->senid[0] >> 5);
  }
  else {
    if (uVar3 != 3) {
      if (bVar1 != 5) {
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          if ((ulong)hmm->senid[uVar6] != 0xffff) {
            uVar2 = hmm->ctx->sseq[hmm->senid[uVar6]][uVar6];
            acmod->senone_active_vec[uVar2 >> 5] =
                 acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
          }
        }
        return;
      }
      if ((ulong)hmm->senid[4] != 0xffff) {
        uVar2 = hmm->ctx->sseq[hmm->senid[4]][4];
        acmod->senone_active_vec[uVar2 >> 5] =
             acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      }
      if ((ulong)hmm->senid[3] != 0xffff) {
        uVar2 = hmm->ctx->sseq[hmm->senid[3]][3];
        acmod->senone_active_vec[uVar2 >> 5] =
             acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      }
    }
    if ((ulong)hmm->senid[2] != 0xffff) {
      uVar2 = hmm->ctx->sseq[hmm->senid[2]][2];
      acmod->senone_active_vec[uVar2 >> 5] =
           acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
    }
    if ((ulong)hmm->senid[1] != 0xffff) {
      uVar2 = hmm->ctx->sseq[hmm->senid[1]][1];
      acmod->senone_active_vec[uVar2 >> 5] =
           acmod->senone_active_vec[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
    }
    if ((ulong)hmm->senid[0] == 0xffff) {
      return;
    }
    uVar2 = *hmm->ctx->sseq[hmm->senid[0]];
    bVar1 = (byte)uVar2;
    puVar4 = (uint *)((ulong)(uVar2 >> 3 & 0xfffffffc) + (long)acmod->senone_active_vec);
  }
  *puVar4 = *puVar4 | 1 << (bVar1 & 0x1f);
  return;
}

Assistant:

void
acmod_activate_hmm(acmod_t *acmod, hmm_t *hmm)
{
    int i;

    if (acmod->compallsen)
        return;
    if (hmm_is_mpx(hmm)) {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            MPX_BITVEC_SET(acmod, hmm, 4);
            MPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            MPX_BITVEC_SET(acmod, hmm, 2);
            MPX_BITVEC_SET(acmod, hmm, 1);
            MPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                MPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
    else {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            NONMPX_BITVEC_SET(acmod, hmm, 4);
            NONMPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            NONMPX_BITVEC_SET(acmod, hmm, 2);
            NONMPX_BITVEC_SET(acmod, hmm, 1);
            NONMPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                NONMPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
}